

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.c
# Opt level: O2

void av1_setup_pre_planes
               (MACROBLOCKD *xd,int idx,YV12_BUFFER_CONFIG *src,int mi_row,int mi_col,
               scale_factors *sf,int num_planes)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  anon_union_24_2_4e86ac8b_for_yv12_buffer_config_10 *paVar4;
  ulong uVar5;
  
  if (src != (YV12_BUFFER_CONFIG *)0x0) {
    uVar2 = 3;
    if (num_planes < 3) {
      uVar2 = num_planes;
    }
    uVar5 = 0;
    uVar3 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar3 = uVar5;
    }
    paVar4 = &src->field_5;
    for (; uVar3 * 0xa30 - uVar5 != 0; uVar5 = uVar5 + 0xa30) {
      uVar1 = (ulong)(uVar5 != 0);
      setup_pred_plane((buf_2d *)((long)&xd->plane[0].pre[idx].buf + uVar5),(*xd->mi)->bsize,
                       (paVar4->field_0).y_buffer,
                       *(int *)((long)src->store_buf_adr + uVar1 * 4 + -0x38),
                       *(int *)((long)src->store_buf_adr + uVar1 * 4 + -0x30),
                       *(int *)((long)src->store_buf_adr + uVar1 * 4 + -0x28),mi_row,mi_col,sf,
                       *(int *)((long)xd->plane[0].pre + (uVar5 - 0x2c)),
                       *(int *)((long)xd->plane[0].pre + (uVar5 - 0x28)));
      paVar4 = (anon_union_24_2_4e86ac8b_for_yv12_buffer_config_10 *)((long)paVar4 + 8);
    }
  }
  return;
}

Assistant:

void av1_setup_pre_planes(MACROBLOCKD *xd, int idx,
                          const YV12_BUFFER_CONFIG *src, int mi_row, int mi_col,
                          const struct scale_factors *sf,
                          const int num_planes) {
  if (src != NULL) {
    // We use AOMMIN(num_planes, MAX_MB_PLANE) instead of num_planes to quiet
    // the static analysis warnings.
    for (int i = 0; i < AOMMIN(num_planes, MAX_MB_PLANE); ++i) {
      struct macroblockd_plane *const pd = &xd->plane[i];
      const int is_uv = i > 0;
      setup_pred_plane(&pd->pre[idx], xd->mi[0]->bsize, src->buffers[i],
                       src->crop_widths[is_uv], src->crop_heights[is_uv],
                       src->strides[is_uv], mi_row, mi_col, sf,
                       pd->subsampling_x, pd->subsampling_y);
    }
  }
}